

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O2

void __thiscall KalmanFilter::KalmanFilter(KalmanFilter *this)

{
  this->_vptr_KalmanFilter = (_func_int **)&PTR__KalmanFilter_0011bd48;
  memset(&this->x_,0,0x88);
  return;
}

Assistant:

KalmanFilter::KalmanFilter() {}